

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_mountHandle(PHYSFS_File *file,char *fname,char *mountPoint,int appendToPath)

{
  undefined4 uVar1;
  int iVar2;
  PHYSFS_Io *io;
  long lVar3;
  PHYSFS_Io *pPVar4;
  PHYSFS_ErrorCode errcode;
  PHYSFS_Io *pPVar5;
  byte bVar6;
  
  bVar6 = 0;
  if ((file == (PHYSFS_File *)0x0) || (fname == (char *)0x0)) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    io = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
    if (io != (PHYSFS_Io *)0x0) {
      pPVar4 = &__PHYSFS_handleIoInterface;
      pPVar5 = io;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        uVar1 = *(undefined4 *)&pPVar4->field_0x4;
        pPVar5->version = pPVar4->version;
        *(undefined4 *)&pPVar5->field_0x4 = uVar1;
        pPVar4 = (PHYSFS_Io *)((long)pPVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pPVar5 = (PHYSFS_Io *)((long)pPVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      io->opaque = file;
      iVar2 = doMount(io,fname,mountPoint,appendToPath);
      if (iVar2 == 0) {
        io->opaque = (void *)0x0;
        (*io->destroy)(io);
        return 0;
      }
      return 1;
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

int PHYSFS_mountHandle(PHYSFS_File *file, const char *fname,
                       const char *mountPoint, int appendToPath)
{
    int retval = 0;
    PHYSFS_Io *io = NULL;

    BAIL_IF(!file, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    io = __PHYSFS_createHandleIo(file);
    BAIL_IF_ERRPASS(!io, 0);
    retval = doMount(io, fname, mountPoint, appendToPath);
    if (!retval)
    {
        /* docs say not to destruct in case of failure, so cheat. */
        io->opaque = NULL;
        io->destroy(io);
    } /* if */

    return retval;
}